

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O3

void __thiscall unitOps_Simple_Test::~unitOps_Simple_Test(unitOps_Simple_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(unitOps, Simple)
{
    EXPECT_EQ(m, m);
    EXPECT_EQ(m * m, m * m);
    EXPECT_NE(m * m, s * s);
    EXPECT_EQ(V / km, mV / m);
    static_assert(
        (V / km).is_exactly_the_same(mV / m), "units not static equivalent");
}